

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

Am_Value_List * __thiscall Am_Value_List::operator=(Am_Value_List *this,Am_Value_List *list)

{
  Am_Value_List_Data *this_00;
  Am_Value_List_Data *old_data;
  Am_Value_List *list_local;
  Am_Value_List *this_local;
  
  this_00 = this->data;
  this->data = list->data;
  this->item = list->item;
  if (this->data != (Am_Value_List_Data *)0x0) {
    Am_Wrapper::Note_Reference(&this->data->super_Am_Wrapper);
  }
  if (this_00 != (Am_Value_List_Data *)0x0) {
    Am_Wrapper::Release(&this_00->super_Am_Wrapper);
  }
  return this;
}

Assistant:

Am_Value_List &
Am_Value_List::operator=(const Am_Value_List &list)
{
  Am_Value_List_Data *old_data = data;
  data = list.data;
  item = list.item;
  if (data)
    data->Note_Reference();
  if (old_data)
    old_data->Release();
  return *this;
}